

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<32,_151>::CompactBreitWignerUncertainties::verifySize
               (int NPL,int NRSA)

{
  undefined8 *puVar1;
  char *args;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>("Encountered empty list");
    args = "NPL should be larger than zero and equal to 12 * NRSA";
  }
  else {
    if (NRSA < 1) {
      tools::Log::error<char_const*>("Encountered illegal NRSA value");
      tools::Log::info<char_const*>("NRSA should be larger than zero");
      goto LAB_0017c5c5;
    }
    if (NRSA * 0xc == NPL) {
      return;
    }
    tools::Log::error<char_const*>("Encountered inconsistent list size");
    args = "NPL must be equal to 12 * NRSA";
  }
  tools::Log::info<char_const*>(args);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
LAB_0017c5c5:
  tools::Log::info<char_const*,int>("NRSA value: {}",NRSA);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NRSA ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 12 * NRSA" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NRSA value: {}", NRSA );
    throw std::exception();
  }

  if ( NRSA < 1 ) {

    Log::error( "Encountered illegal NRSA value" );
    Log::info( "NRSA should be larger than zero" );
    Log::info( "NRSA value: {}", NRSA );
    throw std::exception();
  }

  if ( NPL != 12 * NRSA ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 12 * NRSA" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NRSA value: {}", NRSA );
    throw std::exception();
  }
}